

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  char *pcVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  unsigned_long *in_R9;
  DispatchCallResult DVar5;
  String local_1e8;
  char *local_1c8;
  uint64_t local_1c0;
  _func_int **local_1b8;
  Exception local_1b0;
  
  local_1c0 = requestedTypeId;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            (&local_1e8,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&local_1c0,&local_1c8,in_R9);
  kj::Exception::Exception
            (&local_1b0,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x5c,&local_1e8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_1b8,&local_1b0);
  pp_Var3 = local_1b8;
  local_1b8 = (_func_int **)0x0;
  this->_vptr_Server = pp_Var3;
  *(undefined2 *)&(this->thisHook).ptr = 0x100;
  kj::Exception::~Exception(&local_1b0);
  sVar2 = local_1e8.content.size_;
  pcVar1 = local_1e8.content.ptr;
  uVar4 = extraout_RDX;
  if (local_1e8.content.ptr != (char *)0x0) {
    local_1e8.content.ptr = (char *)0x0;
    local_1e8.content.size_ = 0;
    (**(local_1e8.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    uVar4 = extraout_RDX_00;
  }
  DVar5.isStreaming = (bool)(char)uVar4;
  DVar5.allowCancellation = (bool)(char)((ulong)uVar4 >> 8);
  DVar5._10_6_ = (int6)((ulong)uVar4 >> 0x10);
  DVar5.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar5;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                 actualInterfaceName, requestedTypeId),
    false, true
  };
}